

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O2

bool __thiscall cmCPackExternalGenerator::StagingEnabled(cmCPackExternalGenerator *this)

{
  bool bVar1;
  allocator<char> local_39;
  cmValue local_38;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CPACK_EXTERNAL_ENABLE_STAGING",&local_39);
  local_38 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_30);
  bVar1 = cmValue::IsOff(&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  return !bVar1;
}

Assistant:

bool cmCPackExternalGenerator::StagingEnabled() const
{
  return !this->GetOption("CPACK_EXTERNAL_ENABLE_STAGING").IsOff();
}